

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_get_array_item(AMQP_VALUE value,uint32_t index)

{
  AMQP_VALUE value_00;
  LOGGER_LOG p_Var1;
  int iVar2;
  char *pcVar3;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "NULL value";
    iVar2 = 0x7ae;
  }
  else if (value->type == AMQP_TYPE_ARRAY) {
    if (index < (value->value).binary_value.length) {
      value_00 = *(AMQP_VALUE *)
                  (&((value->value).described_value.descriptor)->type + (ulong)index * 2);
      amqpvalue_clone(value_00);
      return value_00;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "Index out of range: %u";
    iVar2 = 0x7be;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "Value is not of type ARRAY";
    iVar2 = 0x7b8;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_get_array_item",iVar2,1,pcVar3);
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_get_array_item(AMQP_VALUE value, uint32_t index)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_416: [ If the `value` argument is NULL, `amqpvalue_get_array_item` shall fail and return NULL. ] */
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        /* Codes_SRS_AMQPVALUE_01_418: [ If value is not an array then `amqpvalue_get_array_item` shall fail and return NULL. ] */
        if (value_data->type != AMQP_TYPE_ARRAY)
        {
            LogError("Value is not of type ARRAY");
            result = NULL;
        }
        /* Codes_SRS_AMQPVALUE_01_417: [ If `index` is greater or equal to the number of items in the array then `amqpvalue_get_array_item` shall fail and return NULL. ] */
        else if (value_data->value.array_value.count <= index)
        {
            LogError("Index out of range: %u", (unsigned int)index);
            result = NULL;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_414: [ `amqpvalue_get_array_item` shall return a copy of the AMQP_VALUE stored at the 0 based position `index` in the array identified by `value`. ] */
            /* Codes_SRS_AMQPVALUE_01_426: [ If cloning the item at position `index` fails, then `amqpvalue_get_array_item` shall fail and return NULL. ] */
            result = amqpvalue_clone(value_data->value.array_value.items[index]);
        }
    }

    return result;
}